

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O3

value value_type_copy(value v)

{
  type_id id_00;
  int iVar1;
  size_t sVar2;
  value pvVar3;
  void *pvVar4;
  void *pvVar5;
  value pvVar6;
  undefined8 *puVar7;
  size_t sVar8;
  type_id id;
  type_id local_34;
  value local_30;
  
  if (v != (value)0x0) {
    local_34 = 0x14;
    sVar2 = value_size(v);
    value_to((value)((long)v + (sVar2 - 4)),&local_34,4);
    id_00 = local_34;
    iVar1 = type_id_array(local_34);
    if (iVar1 == 0) {
      sVar2 = value_type_count(v);
      pvVar3 = value_type_create((void *)0x0,sVar2 * 8,9);
      pvVar4 = value_data(pvVar3);
      pvVar5 = value_data(v);
      if (sVar2 == 0) {
        return pvVar3;
      }
      sVar8 = 0;
      do {
        pvVar6 = value_type_copy(*(value *)((long)pvVar5 + sVar8 * 8));
        *(value *)((long)pvVar4 + sVar8 * 8) = pvVar6;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
      return pvVar3;
    }
    iVar1 = type_id_map(id_00);
    if (iVar1 == 0) {
      sVar2 = value_type_count(v);
      pvVar3 = value_type_create((void *)0x0,sVar2 * 8,10);
      pvVar4 = value_data(pvVar3);
      pvVar5 = value_data(v);
      if (sVar2 == 0) {
        return pvVar3;
      }
      sVar8 = 0;
      do {
        pvVar6 = value_type_copy(*(value *)((long)pvVar5 + sVar8 * 8));
        *(value *)((long)pvVar4 + sVar8 * 8) = pvVar6;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
      return pvVar3;
    }
    iVar1 = type_id_function(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_copy(v);
      if (pvVar3 != (value)0x0) {
        puVar7 = (undefined8 *)value_data(pvVar3);
        function_increment_reference((function_conflict)*puVar7);
        return pvVar3;
      }
    }
    else {
      iVar1 = type_id_class(id_00);
      if (iVar1 == 0) {
        pvVar3 = value_copy(v);
        if (pvVar3 != (value)0x0) {
          puVar7 = (undefined8 *)value_data(v);
          class_increment_reference((klass)*puVar7);
          return pvVar3;
        }
      }
      else {
        iVar1 = type_id_object(id_00);
        if (iVar1 == 0) {
          pvVar3 = value_copy(v);
          if (pvVar3 != (value)0x0) {
            puVar7 = (undefined8 *)value_data(pvVar3);
            object_increment_reference((object)*puVar7);
            return pvVar3;
          }
        }
        else {
          iVar1 = type_id_exception(id_00);
          if (iVar1 == 0) {
            pvVar3 = value_copy(v);
            if (pvVar3 != (value)0x0) {
              puVar7 = (undefined8 *)value_data(pvVar3);
              exception_increment_reference((exception)*puVar7);
              return pvVar3;
            }
          }
          else {
            iVar1 = type_id_throwable(id_00);
            if (iVar1 == 0) {
              local_30 = v;
              pvVar3 = value_type_create(&local_30,8,0x12);
              return pvVar3;
            }
            iVar1 = type_id_invalid(id_00);
            if (iVar1 != 0) {
              pvVar3 = value_copy(v);
              return pvVar3;
            }
          }
        }
      }
    }
  }
  return (value)0x0;
}

Assistant:

value value_type_copy(value v)
{
	if (v != NULL)
	{
		type_id id = value_type_id(v);

		if (type_id_array(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_array(NULL, size);

			value *new_v_array = value_to_array(new_v);

			value *v_array = value_to_array(v);

			for (index = 0; index < size; ++index)
			{
				new_v_array[index] = value_type_copy(v_array[index]);
			}

			return new_v;
		}
		else if (type_id_map(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_map(NULL, size);

			value *new_v_map = value_to_map(new_v);

			value *v_map = value_to_map(v);

			for (index = 0; index < size; ++index)
			{
				new_v_map[index] = value_type_copy(v_map[index]);
			}

			return new_v;
		}
		else if (type_id_function(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				function f = value_to_function(cpy);

				function_increment_reference(f);
			}

			return cpy;
		}
		else if (type_id_class(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				klass cls = value_to_class(v);

				class_increment_reference(cls);
			}

			return cpy;
		}
		else if (type_id_object(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				object obj = value_to_object(cpy);

				object_increment_reference(obj);
			}

			return cpy;
		}
		else if (type_id_exception(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				exception ex = value_to_exception(cpy);

				exception_increment_reference(ex);
			}

			return cpy;
		}
		else if (type_id_throwable(id) == 0)
		{
			/* Just create a new throwable from the previous one, it will get flattened after creation */
			return value_create_throwable(v);
		}

		if (type_id_invalid(id) != 0)
		{
			return value_copy(v);
		}
	}

	return NULL;
}